

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall duckdb_re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int *piVar1;
  IndexValue *pIVar2;
  bool bVar3;
  bool bVar4;
  Prog *pPVar5;
  ostream *poVar6;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var7;
  IndexValue *pIVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  Inst *pIVar12;
  _Head_base<0UL,_int_*,_false> _Var13;
  SparseSet reachable;
  SparseSetT<void> local_1e0;
  Prog *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  SparseSetT<void>::SparseSetT(&local_1e0,this->size_);
  fanout->size_ = 0;
  pIVar8 = (fanout->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if ((pIVar8 != (IndexValue *)0x0) &&
     (_Var7._M_head_impl.len_ = (Deleter)this->start_,
     (uint)_Var7._M_head_impl.len_ <
     (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
     )) {
    piVar1 = (fanout->sparse_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    piVar1[(int)_Var7._M_head_impl.len_] = 0;
    iVar10 = fanout->size_;
    pIVar8[iVar10].index_ = (int)_Var7._M_head_impl.len_;
    fanout->size_ = iVar10 + 1;
    pIVar8[piVar1[(int)_Var7._M_head_impl.len_]].value_ = 0;
  }
  pPVar5 = this;
  if (pIVar8 != (fanout->dense_).ptr_._M_t.
                super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                _M_head_impl + fanout->size_) {
    do {
      local_1b8 = pPVar5;
      local_1e0.size_ = 0;
      SparseSetT<void>::InsertInternal(&local_1e0,true,pIVar8->index_);
      if (local_1e0.size_ != 0) {
        iVar10 = *local_1e0.dense_.ptr_._M_t.
                  super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar11 = (long)iVar10;
        pIVar12 = (this->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar9 = pIVar12[lVar11].out_opcode_;
        _Var13._M_head_impl =
             local_1e0.dense_.ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        switch(uVar9 & 7) {
        case 0:
          goto switchD_01ce33d5_caseD_0;
        case 1:
          goto switchD_01ce33d5_caseD_1;
        case 2:
          goto switchD_01ce33d5_caseD_2;
        default:
          goto switchD_01ce33d5_caseD_3;
        case 5:
          goto switchD_01ce33d5_caseD_5;
        case 7:
          goto switchD_01ce33d5_caseD_7;
        }
      }
LAB_01ce3555:
      pIVar8 = pIVar8 + 1;
      pPVar5 = local_1b8;
    } while (pIVar8 != (fanout->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                       .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                       _M_head_impl + fanout->size_);
  }
  SparseSetT<void>::~SparseSetT(&local_1e0);
  return;
  do {
    iVar10 = *_Var13._M_head_impl;
    lVar11 = (long)iVar10;
    pIVar12 = (this->inst_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
              .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar9 = pIVar12[lVar11].out_opcode_;
    switch(uVar9 & 7) {
    case 0:
switchD_01ce33d5_caseD_0:
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unhandled ",10);
      poVar6 = (ostream *)std::ostream::operator<<(local_1a8,pIVar12[lVar11].out_opcode_ & 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," in Prog::Fanout()",0x12);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      this = local_1b8;
    case 7:
switchD_01ce33d5_caseD_7:
      _Var13._M_head_impl = _Var13._M_head_impl + 1;
      if (_Var13._M_head_impl ==
          local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
          _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1e0.size_) goto LAB_01ce3555;
      break;
    case 2:
switchD_01ce33d5_caseD_2:
      if ((uVar9 & 8) == 0) {
        SparseSetT<void>::InsertInternal(&local_1e0,true,(int)lVar11 + 1);
      }
      pIVar8->value_ = pIVar8->value_ + 1;
      _Var7._M_head_impl.len_ = (Deleter)(pIVar12[lVar11].out_opcode_ >> 4);
      pIVar2 = (fanout->dense_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
               _M_head_impl;
      bVar3 = (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                             super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                             .
                             super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                             .
                             super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
              <= (uint)_Var7._M_head_impl.len_;
      bVar4 = bVar3 || pIVar2 == (IndexValue *)0x0;
      if (!bVar3 && pIVar2 != (IndexValue *)0x0) {
        uVar9 = (fanout->sparse_).ptr_._M_t.
                super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)_Var7._M_head_impl.len_];
        if (uVar9 < (uint)fanout->size_) {
          if (bVar4 || (Deleter)pIVar2[(int)uVar9].index_ == _Var7._M_head_impl.len_)
          goto switchD_01ce33d5_caseD_7;
        }
        else if (bVar4) goto switchD_01ce33d5_caseD_7;
        piVar1 = (fanout->sparse_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        piVar1[(uint)_Var7._M_head_impl.len_] = fanout->size_;
        iVar10 = fanout->size_;
        pIVar2[iVar10].index_ = (int)_Var7._M_head_impl.len_;
        fanout->size_ = iVar10 + 1;
        pIVar2[piVar1[(uint)_Var7._M_head_impl.len_]].value_ = 0;
      }
      goto switchD_01ce33d5_caseD_7;
    default:
switchD_01ce33d5_caseD_3:
      if ((uVar9 & 8) == 0) {
        SparseSetT<void>::InsertInternal(&local_1e0,true,(int)lVar11 + 1);
      }
      uVar9 = pIVar12[lVar11].out_opcode_ >> 4;
      goto LAB_01ce353e;
    case 5:
switchD_01ce33d5_caseD_5:
      if ((uVar9 & 8) != 0) goto switchD_01ce33d5_caseD_7;
    case 1:
switchD_01ce33d5_caseD_1:
      uVar9 = iVar10 + 1;
LAB_01ce353e:
      SparseSetT<void>::InsertInternal(&local_1e0,true,uVar9);
      goto switchD_01ce33d5_caseD_7;
    }
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}